

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Type TVar5;
  int iVar6;
  int iVar7;
  pointer pIVar8;
  TestEventListeners *this_00;
  TestEventListener *pTVar9;
  TimeInMillis TVar10;
  Random *this_01;
  UnitTestImpl *this_02;
  char *__s;
  undefined8 uVar11;
  TestSuite *pTVar12;
  uint local_c0;
  int local_bc;
  undefined1 local_b0 [16];
  int local_a0;
  int local_9c;
  int test_index_1;
  int j_1;
  int test_index;
  allocator<char> local_81;
  string local_80 [32];
  string *local_60;
  string *result;
  TestPartResult *test_part_result;
  TestResult *pTStack_48;
  int j;
  TestResult *test_result;
  Timer timer;
  int i;
  bool gtest_repeat_forever;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  bool in_subprocess_for_death_test;
  bool gtest_is_initialized_before_run_all_tests;
  UnitTestImpl *this_local;
  
  bVar2 = GTestIsInitialized();
  if ((g_help_flag & 1) == 0) {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    pIVar8 = std::
             unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ::get(&this->internal_run_death_test_flag_);
    bVar3 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",pIVar8 != (pointer)0x0);
    iVar4 = FilterTests(this,(uint)!bVar3);
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      if ((FLAGS_gtest_shuffle & 1) == 0) {
        local_bc = 0;
      }
      else {
        local_bc = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
      }
      this->random_seed_ = local_bc;
      bVar1 = 0;
      this_00 = listeners(this);
      pTVar9 = TestEventListeners::repeater(this_00);
      TVar10 = GetTimeInMillis();
      this->start_timestamp_ = TVar10;
      (*pTVar9->_vptr_TestEventListener[2])(pTVar9,this->parent_);
      if (pIVar8 != (pointer)0x0) {
        local_c0 = 1;
      }
      else {
        local_c0 = FLAGS_gtest_repeat;
      }
      timer.start_.__d.__r._4_4_ = 0;
LAB_00140b9c:
      if ((int)local_c0 < 0 || timer.start_.__d.__r._4_4_ != local_c0) {
        ClearNonAdHocTestResult(this);
        Timer::Timer((Timer *)&test_result);
        if ((0 < iVar4) && ((FLAGS_gtest_shuffle & 1) != 0)) {
          this_01 = (Random *)random(this);
          Random::Reseed(this_01,this->random_seed_);
          ShuffleTests(this);
        }
        (*pTVar9->_vptr_TestEventListener[3])
                  (pTVar9,this->parent_,(ulong)timer.start_.__d.__r._4_4_);
        if (0 < iVar4) {
          (*pTVar9->_vptr_TestEventListener[4])(pTVar9,this->parent_);
          ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                    (&this->environments_,SetUpEnvironment);
          (*pTVar9->_vptr_TestEventListener[5])(pTVar9,this->parent_);
          bVar3 = Test::IsSkipped();
          if (bVar3) {
            this_02 = GetUnitTestImpl();
            pTStack_48 = current_test_result(this_02);
            for (test_part_result._4_4_ = 0; iVar7 = test_part_result._4_4_,
                iVar6 = TestResult::total_part_count(pTStack_48), iVar7 < iVar6;
                test_part_result._4_4_ = test_part_result._4_4_ + 1) {
              result = (string *)TestResult::GetTestPartResult(pTStack_48,test_part_result._4_4_);
              TVar5 = TestPartResult::type((TestPartResult *)result);
              if (TVar5 == kSkip) {
                __s = TestPartResult::message((TestPartResult *)result);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>(local_80,__s,&local_81);
                std::allocator<char>::~allocator(&local_81);
                local_60 = local_80;
                uVar11 = std::__cxx11::string::c_str();
                printf("%s\n",uVar11);
                std::__cxx11::string::~string(local_80);
              }
            }
            fflush(_stdout);
          }
          else {
            bVar3 = Test::HasFatalFailure();
            if (bVar3) {
              bVar3 = Test::HasFatalFailure();
              if (bVar3) {
                for (local_a0 = 0; iVar7 = local_a0, iVar6 = total_test_suite_count(this),
                    iVar7 < iVar6; local_a0 = local_a0 + 1) {
                  pTVar12 = GetMutableSuiteCase(this,local_a0);
                  TestSuite::Skip(pTVar12);
                }
              }
            }
            else {
              for (test_index_1 = 0; iVar7 = test_index_1, iVar6 = total_test_suite_count(this),
                  iVar7 < iVar6; test_index_1 = test_index_1 + 1) {
                pTVar12 = GetMutableSuiteCase(this,test_index_1);
                TestSuite::Run(pTVar12);
                if ((FLAGS_gtest_fail_fast & 1) != 0) {
                  pTVar12 = GetMutableSuiteCase(this,test_index_1);
                  bVar3 = TestSuite::Failed(pTVar12);
                  iVar7 = test_index_1;
                  if (bVar3) goto LAB_00140e53;
                }
              }
            }
          }
          goto LAB_00140f26;
        }
        goto LAB_00140f9e;
      }
      (*pTVar9->_vptr_TestEventListener[0x10])(pTVar9,this->parent_);
      if (!bVar2) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      this_local._7_1_ = (bool)(bVar1 ^ 1);
    }
    else {
      ListTestsMatchingFilter(this);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
LAB_00140e53:
  while( true ) {
    local_9c = iVar7 + 1;
    iVar7 = local_9c;
    iVar6 = total_test_suite_count(this);
    if (iVar6 <= iVar7) break;
    pTVar12 = GetMutableSuiteCase(this,local_9c);
    TestSuite::Skip(pTVar12);
    iVar7 = local_9c;
  }
LAB_00140f26:
  (*pTVar9->_vptr_TestEventListener[0xd])(pTVar9,this->parent_);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
             (local_b0 + 8));
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)local_b0);
  __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
              *)(local_b0 + 8),
             (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
              *)local_b0,TearDownEnvironment);
  (*pTVar9->_vptr_TestEventListener[0xe])(pTVar9,this->parent_);
LAB_00140f9e:
  TVar10 = Timer::Elapsed((Timer *)&test_result);
  this->elapsed_time_ = TVar10;
  (*pTVar9->_vptr_TestEventListener[0xf])(pTVar9,this->parent_,(ulong)timer.start_.__d.__r._4_4_);
  bVar3 = Passed(this);
  if (!bVar3) {
    bVar1 = 1;
  }
  UnshuffleTests(this);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    iVar7 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar7;
  }
  timer.start_.__d.__r._4_4_ = timer.start_.__d.__r._4_4_ + 1;
  goto LAB_00140b9c;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test =
      (internal_run_death_test_flag_.get() != nullptr);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;
  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(GTestColor::kRed,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}